

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
cmGeneratorTarget::ResolveLinkerWrapper
          (cmGeneratorTarget *this,
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *result,string *language,bool joinItems)

{
  pointer pbVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pBVar4;
  pointer pbVar5;
  undefined1 *puVar6;
  undefined8 uVar7;
  int iVar8;
  long *plVar9;
  string *psVar10;
  long lVar11;
  cmake *this_00;
  undefined7 in_register_00000009;
  size_type *psVar12;
  bool bVar13;
  iterator __position;
  cmMakefile *pcVar14;
  cmMakefile *pcVar15;
  long lVar16;
  BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *pBVar17;
  string_view arg;
  string_view str;
  string_view separator;
  string_view sep;
  string value;
  string SHELL;
  string LINKER;
  string wrapper;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  linkerOptions;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  options;
  string wrapperSep;
  cmListFileBacktrace bt;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  wrapperFlag;
  string LINKER_SHELL;
  bool local_1ec;
  undefined1 local_1e8 [32];
  element_type *local_1c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1c0;
  size_type *local_1b8;
  size_type local_1b0;
  size_type local_1a8;
  undefined8 uStack_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  long *local_158;
  size_t local_150;
  long local_148 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138;
  undefined1 local_118 [80];
  undefined1 local_c8 [16];
  undefined1 local_b8 [24];
  _Alloc_hider _Stack_a0;
  const_iterator local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_118._44_4_ = (undefined4)CONCAT71(in_register_00000009,joinItems);
  pcVar15 = this->Makefile;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_118 + 0x50),"CMAKE_",language);
  local_118._32_8_ = this;
  plVar9 = (long *)std::__cxx11::string::append((char *)(local_118 + 0x50));
  puVar6 = local_1e8 + 0x10;
  psVar12 = (size_type *)(plVar9 + 2);
  if ((size_type *)*plVar9 == psVar12) {
    local_1e8._16_8_ = *psVar12;
    local_1e8._24_8_ = plVar9[3];
    local_1e8._0_8_ = puVar6;
  }
  else {
    local_1e8._16_8_ = *psVar12;
    local_1e8._0_8_ = (size_type *)*plVar9;
  }
  local_1e8._8_8_ = plVar9[1];
  *plVar9 = (long)psVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  psVar10 = cmMakefile::GetSafeDefinition(pcVar15,(string *)local_1e8);
  local_158 = local_148;
  pcVar3 = (psVar10->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_158,pcVar3,pcVar3 + psVar10->_M_string_length);
  uVar7 = local_118._32_8_;
  if ((undefined1 *)local_1e8._0_8_ != puVar6) {
    operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
  }
  if ((_Base_ptr)local_c8._0_8_ != (_Base_ptr)(local_118 + 0x60)) {
    operator_delete((void *)local_c8._0_8_,(ulong)(local_b8._0_8_ + 1));
  }
  arg._M_str = (char *)local_158;
  arg._M_len = local_150;
  cmExpandedList_abi_cxx11_(&local_80,arg,false);
  pcVar15 = *(cmMakefile **)(uVar7 + 8);
  std::operator+(&local_178,"CMAKE_",language);
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_178);
  psVar12 = (size_type *)(plVar9 + 2);
  if ((size_type *)*plVar9 == psVar12) {
    local_1e8._16_8_ = *psVar12;
    local_1e8._24_8_ = plVar9[3];
    local_1e8._0_8_ = puVar6;
  }
  else {
    local_1e8._16_8_ = *psVar12;
    local_1e8._0_8_ = (size_type *)*plVar9;
  }
  local_1e8._8_8_ = plVar9[1];
  *plVar9 = (long)psVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  psVar10 = cmMakefile::GetSafeDefinition(pcVar15,(string *)local_1e8);
  pcVar3 = (psVar10->_M_dataplus)._M_p;
  local_c8._0_8_ = (_Base_ptr)(local_118 + 0x60);
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_118 + 0x50),pcVar3,pcVar3 + psVar10->_M_string_length);
  if ((undefined1 *)local_1e8._0_8_ != puVar6) {
    operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
  }
  local_1ec = true;
  if ((local_80.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       local_80.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     (iVar8 = std::__cxx11::string::compare
                        ((char *)(local_80.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish + -1)), iVar8 == 0)) {
    pbVar1 = local_80.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
    pcVar3 = local_80.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_dataplus._M_p;
    pbVar5 = local_80.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + -1;
    local_80.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar3 != &pbVar5->field_2) {
      operator_delete(pcVar3,(pbVar5->field_2)._M_allocated_capacity + 1);
    }
    local_1ec = false;
  }
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"LINKER:","");
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,"SHELL:","");
  std::operator+(&local_50,&local_178,&local_198);
  do {
    pBVar17 = (result->
              super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pBVar4 = (result->
             super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    lVar16 = ((long)pBVar4 - (long)pBVar17 >> 4) * -0x5555555555555555 >> 2;
    if (0 < lVar16) {
      lVar16 = lVar16 + 1;
      do {
        iVar8 = std::__cxx11::string::compare((ulong)pBVar17,0,(string *)local_178._M_string_length)
        ;
        __position._M_current = pBVar17;
        if (iVar8 == 0) goto LAB_00445d36;
        iVar8 = std::__cxx11::string::compare
                          ((ulong)(pBVar17 + 1),0,(string *)local_178._M_string_length);
        __position._M_current = pBVar17 + 1;
        if (iVar8 == 0) goto LAB_00445d36;
        iVar8 = std::__cxx11::string::compare
                          ((ulong)(pBVar17 + 2),0,(string *)local_178._M_string_length);
        __position._M_current = pBVar17 + 2;
        if (iVar8 == 0) goto LAB_00445d36;
        iVar8 = std::__cxx11::string::compare
                          ((ulong)(pBVar17 + 3),0,(string *)local_178._M_string_length);
        __position._M_current = pBVar17 + 3;
        if (iVar8 == 0) goto LAB_00445d36;
        pBVar17 = pBVar17 + 4;
        lVar16 = lVar16 + -1;
      } while (1 < lVar16);
    }
    lVar16 = ((long)pBVar4 - (long)pBVar17 >> 4) * -0x5555555555555555;
    if (lVar16 == 1) {
LAB_00445d13:
      iVar8 = std::__cxx11::string::compare((ulong)pBVar17,0,(string *)local_178._M_string_length);
      __position._M_current = pBVar4;
      if (iVar8 == 0) {
        __position._M_current = pBVar17;
      }
    }
    else {
      __position._M_current = pBVar17;
      if (lVar16 == 2) {
LAB_00445ce5:
        iVar8 = std::__cxx11::string::compare
                          ((ulong)__position._M_current,0,(string *)local_178._M_string_length);
        if (iVar8 != 0) {
          pBVar17 = __position._M_current + 1;
          goto LAB_00445d13;
        }
      }
      else {
        __position._M_current = pBVar4;
        if ((lVar16 == 3) &&
           (iVar8 = std::__cxx11::string::compare
                              ((ulong)pBVar17,0,(string *)local_178._M_string_length),
           __position._M_current = pBVar17, iVar8 != 0)) {
          __position._M_current = pBVar17 + 1;
          goto LAB_00445ce5;
        }
      }
    }
LAB_00445d36:
    if (__position._M_current ==
        (result->
        super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) break;
    local_1b8 = (size_type *)((__position._M_current)->Value)._M_dataplus._M_p;
    paVar2 = &((__position._M_current)->Value).field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1b8 == paVar2) {
      local_1a8 = paVar2->_M_allocated_capacity;
      uStack_1a0 = *(undefined8 *)((long)&((__position._M_current)->Value).field_2 + 8);
      local_1b8 = &local_1a8;
    }
    else {
      local_1a8 = paVar2->_M_allocated_capacity;
    }
    local_1b0 = ((__position._M_current)->Value)._M_string_length;
    ((__position._M_current)->Value)._M_dataplus._M_p = (pointer)paVar2;
    ((__position._M_current)->Value)._M_string_length = 0;
    ((__position._M_current)->Value).field_2._M_local_buf[0] = '\0';
    local_90._M_allocated_capacity =
         (size_type)
         ((__position._M_current)->Backtrace).
         super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
         super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr;
    local_90._8_8_ =
         ((__position._M_current)->Backtrace).
         super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
         super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    ((__position._M_current)->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
    TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    ((__position._M_current)->Backtrace).super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
    TopEntry.
    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    local_98._M_current =
         (BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
         std::
         vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::_M_erase(result,__position);
    local_138.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_138.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_138.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    iVar8 = std::__cxx11::string::compare((ulong)&local_1b8,0,(string *)local_50._M_string_length);
    if (iVar8 == 0) {
      cmSystemTools::ParseUnixCommandLine
                ((char *)((long)local_1b8 + local_50._M_string_length),&local_138);
    }
    else {
      std::__cxx11::string::substr((ulong)local_1e8,(ulong)&local_1b8);
      str._M_str = (char *)local_1e8._0_8_;
      str._M_len = local_1e8._8_8_;
      sep._M_str = ",";
      sep._M_len = 1;
      cmTokenize_abi_cxx11_(&local_68,str,sep);
      local_118._16_8_ =
           local_138.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_118._8_8_ =
           local_138.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_118._0_8_ =
           local_138.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_138.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           local_68.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_138.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_68.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_138.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           local_68.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_118);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_68);
      if ((undefined1 *)local_1e8._0_8_ != local_1e8 + 0x10) {
        operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
      }
    }
    pbVar1 = local_138.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar13 = false;
    if ((local_138.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         local_138.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish) &&
       (((long)local_138.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish -
         (long)local_138.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start != 0x20 ||
        ((((deque<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            *)&(local_138.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)->
         super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         )._M_impl.super__Deque_impl_data._M_map_size != 0)))) {
      lVar16 = (long)local_138.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_138.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 7;
      pcVar15 = (cmMakefile *)
                local_138.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (0 < lVar16) {
        lVar16 = lVar16 + 1;
        do {
          lVar11 = std::__cxx11::string::find((char *)pcVar15,(ulong)local_198._M_dataplus._M_p,0);
          pcVar14 = pcVar15;
          if (lVar11 != -1) goto LAB_0044607d;
          pcVar14 = (cmMakefile *)
                    &(pcVar15->FindPackageRootPathStack).
                     super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_start._M_last;
          lVar11 = std::__cxx11::string::find((char *)pcVar14,(ulong)local_198._M_dataplus._M_p,0);
          if (lVar11 != -1) goto LAB_0044607d;
          pcVar14 = (cmMakefile *)
                    &(pcVar15->FindPackageRootPathStack).
                     super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_last;
          lVar11 = std::__cxx11::string::find((char *)pcVar14,(ulong)local_198._M_dataplus._M_p,0);
          if (lVar11 != -1) goto LAB_0044607d;
          pcVar14 = (cmMakefile *)
                    &(pcVar15->CMP0054ReportedIds)._M_t._M_impl.super__Rb_tree_header._M_header.
                     _M_parent;
          lVar11 = std::__cxx11::string::find((char *)pcVar14,(ulong)local_198._M_dataplus._M_p,0);
          if (lVar11 != -1) goto LAB_0044607d;
          pcVar15 = (cmMakefile *)&pcVar15->Targets;
          lVar16 = lVar16 + -1;
        } while (1 < lVar16);
      }
      lVar16 = (long)pbVar1 - (long)pcVar15 >> 5;
      if (lVar16 == 1) {
LAB_0044605e:
        lVar16 = std::__cxx11::string::find((char *)pcVar15,(ulong)local_198._M_dataplus._M_p,0);
        pcVar14 = (cmMakefile *)pbVar1;
        if (lVar16 != -1) {
          pcVar14 = pcVar15;
        }
      }
      else {
        pcVar14 = pcVar15;
        if (lVar16 == 2) {
LAB_00446015:
          lVar16 = std::__cxx11::string::find((char *)pcVar14,(ulong)local_198._M_dataplus._M_p,0);
          if (lVar16 == -1) {
            pcVar15 = (cmMakefile *)
                      &(pcVar14->FindPackageRootPathStack).
                       super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_last;
            goto LAB_0044605e;
          }
        }
        else {
          pcVar14 = (cmMakefile *)pbVar1;
          if ((lVar16 == 3) &&
             (lVar16 = std::__cxx11::string::find
                                 ((char *)pcVar15,(ulong)local_198._M_dataplus._M_p,0),
             pcVar14 = pcVar15, lVar16 == -1)) {
            pcVar14 = (cmMakefile *)
                      &(pcVar15->FindPackageRootPathStack).
                       super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_last;
            goto LAB_00446015;
          }
        }
      }
LAB_0044607d:
      if (pcVar14 ==
          (cmMakefile *)
          local_138.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        anon_unknown.dwarf_19d1ab4::wrapOptions
                  ((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_118,&local_138,(cmListFileBacktrace *)&local_90,&local_80,
                   (string *)(local_118 + 0x50),local_1ec);
        if (local_118[0x2c] == '\0') {
          std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<BT<std::__cxx11::string>*,std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>>
                    ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                     result,local_98._M_current,local_118._0_8_,local_118._8_8_);
        }
        else {
          local_68.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)local_118._0_8_;
          local_68.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_118._8_8_;
          separator._M_str = " ";
          separator._M_len = 1;
          cmJoin<cmRange<__gnu_cxx::__normal_iterator<BT<std::__cxx11::string>const*,std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>>>>
                    ((string *)(local_118 + 0x30),
                     (cmRange<__gnu_cxx::__normal_iterator<const_BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                      *)&local_68,separator);
          local_b8._16_8_ = (element_type *)0x0;
          _Stack_a0._M_p = (pointer)0x0;
          cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack
                    ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)(local_b8 + 0x10));
          if ((undefined1 *)local_118._48_8_ == local_118 + 0x40) {
            local_1e8._24_8_ = local_118._72_8_;
            local_1e8._0_8_ = local_1e8 + 0x10;
          }
          else {
            local_1e8._0_8_ = local_118._48_8_;
          }
          local_1e8._17_7_ = local_118._65_7_;
          local_1e8[0x10] = local_118[0x40];
          local_1e8._8_8_ = local_118._56_8_;
          local_118._56_8_ = 0;
          local_118[0x40] = 0;
          local_1c8 = (element_type *)local_b8._16_8_;
          _Stack_1c0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_a0._M_p;
          local_b8._16_8_ = (element_type *)0x0;
          _Stack_a0._M_p = (pointer)0x0;
          local_118._48_8_ = local_118 + 0x40;
          std::
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::_M_insert_rval(result,local_98,(value_type *)local_1e8);
          if (_Stack_1c0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1c0._M_pi);
          }
          if ((undefined1 *)local_1e8._0_8_ != local_1e8 + 0x10) {
            operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_a0._M_p !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_a0._M_p);
          }
          if ((undefined1 *)local_118._48_8_ != local_118 + 0x40) {
            operator_delete((void *)local_118._48_8_,CONCAT71(local_118._65_7_,local_118[0x40]) + 1)
            ;
          }
        }
        std::
        vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~vector((vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_118);
        bVar13 = false;
      }
      else {
        this_00 = cmLocalGenerator::GetCMakeInstance
                            (*(cmLocalGenerator **)(local_118._32_8_ + 0x10));
        local_1e8._0_8_ = local_1e8 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1e8,
                   "\'SHELL:\' prefix is not supported as part of \'LINKER:\' arguments.","");
        GetBacktrace((cmGeneratorTarget *)local_118);
        cmake::IssueMessage(this_00,FATAL_ERROR,(string *)local_1e8,(cmListFileBacktrace *)local_118
                           );
        if ((cmMakefile *)local_118._8_8_ != (cmMakefile *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
        }
        if ((undefined1 *)local_1e8._0_8_ != local_1e8 + 0x10) {
          operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
        }
        bVar13 = true;
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_138);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_90._8_8_);
    }
    if (local_1b8 != &local_1a8) {
      operator_delete(local_1b8,local_1a8 + 1);
    }
  } while (!bVar13);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,local_178.field_2._M_allocated_capacity + 1);
  }
  if ((_Base_ptr)local_c8._0_8_ != (_Base_ptr)(local_118 + 0x60)) {
    operator_delete((void *)local_c8._0_8_,(ulong)(local_b8._0_8_ + 1));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_80);
  if (local_158 != local_148) {
    operator_delete(local_158,local_148[0] + 1);
  }
  return result;
}

Assistant:

std::vector<BT<std::string>>& cmGeneratorTarget::ResolveLinkerWrapper(
  std::vector<BT<std::string>>& result, const std::string& language,
  bool joinItems) const
{
  // replace "LINKER:" prefixed elements by actual linker wrapper
  const std::string wrapper(this->Makefile->GetSafeDefinition(
    "CMAKE_" + language +
    (this->IsDeviceLink() ? "_DEVICE_LINKER_WRAPPER_FLAG"
                          : "_LINKER_WRAPPER_FLAG")));
  std::vector<std::string> wrapperFlag = cmExpandedList(wrapper);
  const std::string wrapperSep(this->Makefile->GetSafeDefinition(
    "CMAKE_" + language +
    (this->IsDeviceLink() ? "_DEVICE_LINKER_WRAPPER_FLAG_SEP"
                          : "_LINKER_WRAPPER_FLAG_SEP")));
  bool concatFlagAndArgs = true;
  if (!wrapperFlag.empty() && wrapperFlag.back() == " ") {
    concatFlagAndArgs = false;
    wrapperFlag.pop_back();
  }

  const std::string LINKER{ "LINKER:" };
  const std::string SHELL{ "SHELL:" };
  const std::string LINKER_SHELL = LINKER + SHELL;

  std::vector<BT<std::string>>::iterator entry;
  while ((entry = std::find_if(result.begin(), result.end(),
                               [&LINKER](BT<std::string> const& item) -> bool {
                                 return item.Value.compare(0, LINKER.length(),
                                                           LINKER) == 0;
                               })) != result.end()) {
    std::string value = std::move(entry->Value);
    cmListFileBacktrace bt = std::move(entry->Backtrace);
    entry = result.erase(entry);

    std::vector<std::string> linkerOptions;
    if (value.compare(0, LINKER_SHELL.length(), LINKER_SHELL) == 0) {
      cmSystemTools::ParseUnixCommandLine(
        value.c_str() + LINKER_SHELL.length(), linkerOptions);
    } else {
      linkerOptions = cmTokenize(value.substr(LINKER.length()), ",");
    }

    if (linkerOptions.empty() ||
        (linkerOptions.size() == 1 && linkerOptions.front().empty())) {
      continue;
    }

    // for now, raise an error if prefix SHELL: is part of arguments
    if (std::find_if(linkerOptions.begin(), linkerOptions.end(),
                     [&SHELL](const std::string& item) -> bool {
                       return item.find(SHELL) != std::string::npos;
                     }) != linkerOptions.end()) {
      this->LocalGenerator->GetCMakeInstance()->IssueMessage(
        MessageType::FATAL_ERROR,
        "'SHELL:' prefix is not supported as part of 'LINKER:' arguments.",
        this->GetBacktrace());
      return result;
    }

    std::vector<BT<std::string>> options = wrapOptions(
      linkerOptions, bt, wrapperFlag, wrapperSep, concatFlagAndArgs);
    if (joinItems) {
      result.insert(entry,
                    cmJoin(cmRange<decltype(options.cbegin())>(
                             options.cbegin(), options.cend()),
                           " "_s));
    } else {
      result.insert(entry, options.begin(), options.end());
    }
  }
  return result;
}